

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O1

CURLcode AddFormData(FormData **formp,formtype type,void *line,size_t length,curl_off_t *size)

{
  int iVar1;
  FormData *pFVar2;
  char *__dest;
  CURLcode CVar3;
  CURLcode CVar4;
  stat file;
  stat64 local_c0;
  
  pFVar2 = (FormData *)(*Curl_cmalloc)(0x20);
  CVar4 = CURLE_OUT_OF_MEMORY;
  if (pFVar2 != (FormData *)0x0) {
    pFVar2->next = (FormData *)0x0;
    if (type < FORM_CALLBACK) {
      if (length == 0) {
        length = strlen((char *)line);
      }
      __dest = (char *)(*Curl_cmalloc)(length + 1);
      pFVar2->line = __dest;
      if (__dest == (char *)0x0) {
        (*Curl_cfree)(pFVar2);
        return CURLE_OUT_OF_MEMORY;
      }
      memcpy(__dest,line,length);
      pFVar2->length = length;
      pFVar2->line[length] = '\0';
    }
    else {
      pFVar2->line = (char *)line;
    }
    pFVar2->type = type;
    if (*formp != (FormData *)0x0) {
      (*formp)->next = pFVar2;
    }
    *formp = pFVar2;
    CVar3 = CURLE_OK;
    CVar4 = CURLE_OK;
    if (size != (curl_off_t *)0x0) {
      CVar4 = CVar3;
      if (type == FORM_FILE) {
        iVar1 = curl_strequal("-",pFVar2->line);
        if (iVar1 == 0) {
          iVar1 = stat64(pFVar2->line,&local_c0);
          if ((iVar1 == 0) && ((local_c0.st_mode & 0xf000) != 0x4000)) {
            *size = *size + local_c0.st_size;
          }
          else {
            CVar4 = CURLE_BAD_FUNCTION_ARGUMENT;
          }
        }
      }
      else {
        *size = *size + length;
      }
    }
  }
  return CVar4;
}

Assistant:

static CURLcode AddFormData(struct FormData **formp,
                            enum formtype type,
                            const void *line,
                            size_t length,
                            curl_off_t *size)
{
  struct FormData *newform = malloc(sizeof(struct FormData));
  if(!newform)
    return CURLE_OUT_OF_MEMORY;
  newform->next = NULL;

  if(type <= FORM_CONTENT) {
    /* we make it easier for plain strings: */
    if(!length)
      length = strlen((char *)line);

    newform->line = malloc(length+1);
    if(!newform->line) {
      free(newform);
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(newform->line, line, length);
    newform->length = length;
    newform->line[length]=0; /* zero terminate for easier debugging */
  }
  else
    /* For callbacks and files we don't have any actual data so we just keep a
       pointer to whatever this points to */
    newform->line = (char *)line;

  newform->type = type;

  if(*formp) {
    (*formp)->next = newform;
    *formp = newform;
  }
  else
    *formp = newform;

  if(size) {
    if(type != FORM_FILE)
      /* for static content as well as callback data we add the size given
         as input argument */
      *size += length;
    else {
      /* Since this is a file to be uploaded here, add the size of the actual
         file */
      if(!strequal("-", newform->line)) {
        struct_stat file;
        if(!stat(newform->line, &file) && !S_ISDIR(file.st_mode))
          *size += filesize(newform->line, file);
        else
          return CURLE_BAD_FUNCTION_ARGUMENT;
      }
    }
  }
  return CURLE_OK;
}